

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

bool __thiscall
lzham::lzcompressor::state::encode
          (state *this,symbol_codec *codec,CLZBase *lzbase,search_accelerator *dict,
          lzdecision *lzdec)

{
  undefined8 uVar1;
  byte bVar2;
  int iVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  adaptive_bit_model *paVar11;
  quasi_adaptive_huffman_data_model *model;
  char *model_00;
  ulong uVar12;
  uint uVar13;
  
  if ((int)(lzdec->m_pos - this->m_block_start_dict_ofs) < 1) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)(dict->m_dict).m_p[lzdec->m_pos - 1];
  }
  bVar7 = symbol_codec::encode
                    (codec,(uint)(0 < lzdec->m_len),
                     (adaptive_bit_model *)
                     ((long)(&this->super_state_base + 1) +
                     (ulong)((this->super_state_base).m_cur_state << 6 | (uint)(uVar12 >> 2)) * 2 +
                     4),true);
  if (!bVar7) {
    return false;
  }
  if (lzdec->m_len < 1) {
    uVar13 = lzdec->m_pos;
    puVar4 = (dict->m_dict).m_p;
    bVar2 = puVar4[uVar13];
    if ((this->super_state_base).m_cur_state < 7) {
      uVar8 = 0;
      if (1 < (int)(uVar13 - this->m_block_start_dict_ofs)) {
        uVar8 = puVar4[uVar13 - 2] >> 2 & 0x38;
      }
      model = (quasi_adaptive_huffman_data_model *)
              (this->m_lit_table[0].m_unused_alignment +
              ((ulong)(((uint)uVar12 >> 5 | uVar8) << 7) - 0x50));
    }
    else {
      uVar8 = (this->super_state_base).m_match_hist[0];
      bVar2 = bVar2 ^ puVar4[uVar13 - uVar8 & dict->m_max_dict_size_mask];
      model = (quasi_adaptive_huffman_data_model *)
              (this->m_delta_lit_table[0].m_unused_alignment +
              ((ulong)((puVar4[~uVar8 + uVar13 & dict->m_max_dict_size_mask] >> 2 & 0x38 |
                       (uint)(puVar4[uVar13 - uVar8 & dict->m_max_dict_size_mask] >> 5)) << 7) -
              0x50));
    }
    bVar7 = symbol_codec::encode(codec,(uint)bVar2,model);
    if (!bVar7) {
      return false;
    }
    uVar13 = (this->super_state_base).m_cur_state;
    uVar9 = 0;
    if (3 < uVar13) {
      if (uVar13 < 10) {
        uVar9 = uVar13 - 3;
      }
      else {
        uVar9 = uVar13 - 6;
      }
    }
LAB_00109828:
    (this->super_state_base).m_cur_state = uVar9;
    (this->super_state_base).m_cur_ofs = lzdec->m_len + lzdec->m_pos + (uint)(lzdec->m_len == 0);
    return true;
  }
  paVar11 = (adaptive_bit_model *)
            ((long)this->m_lit_table + (ulong)(this->super_state_base).m_cur_state * 2 + -0x7c);
  if (lzdec->m_dist < 0) {
    bVar7 = symbol_codec::encode(codec,1,paVar11,true);
    if (bVar7) {
      iVar3 = lzdec->m_dist;
      paVar11 = (adaptive_bit_model *)
                ((long)this->m_lit_table + (ulong)(this->super_state_base).m_cur_state * 2 + -100);
      if (iVar3 == -1) {
        bVar7 = symbol_codec::encode(codec,1,paVar11,true);
        if (!bVar7) {
          return false;
        }
        paVar11 = (adaptive_bit_model *)
                  ((long)this->m_lit_table + (ulong)(this->super_state_base).m_cur_state * 2 + -0x4c
                  );
        if (lzdec->m_len == 1) {
          bVar7 = symbol_codec::encode(codec,1,paVar11,true);
          if (!bVar7) {
            return false;
          }
          uVar9 = (uint)(6 < (this->super_state_base).m_cur_state) * 2 + 9;
          goto LAB_00109828;
        }
        bVar7 = symbol_codec::encode(codec,0,paVar11,true);
        if (!bVar7) {
          return false;
        }
        bVar7 = symbol_codec::encode
                          (codec,lzdec->m_len - 2,
                           this->m_rep_len_table + (6 < (this->super_state_base).m_cur_state));
        if (!bVar7) {
          return false;
        }
      }
      else {
        bVar7 = symbol_codec::encode(codec,0,paVar11,true);
        if (!bVar7) {
          return false;
        }
        bVar7 = symbol_codec::encode
                          (codec,lzdec->m_len - 2,
                           this->m_rep_len_table + (6 < (this->super_state_base).m_cur_state));
        if (!bVar7) {
          return false;
        }
        paVar11 = (adaptive_bit_model *)
                  ((long)this->m_lit_table + (ulong)(this->super_state_base).m_cur_state * 2 + -0x34
                  );
        if (iVar3 == -2) {
          bVar7 = symbol_codec::encode(codec,1,paVar11,true);
          if (!bVar7) {
            return false;
          }
          uVar1 = *(undefined8 *)(this->super_state_base).m_match_hist;
          *(ulong *)(this->super_state_base).m_match_hist =
               CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
        }
        else {
          bVar7 = symbol_codec::encode(codec,0,paVar11,true);
          if (!bVar7) {
            return false;
          }
          model_00 = this->m_lit_table[0].m_unused_alignment +
                     (ulong)(this->super_state_base).m_cur_state * 2 + -0x6c;
          if (iVar3 == -3) {
            bVar7 = symbol_codec::encode(codec,1,(adaptive_bit_model *)model_00,true);
            if (!bVar7) {
              return false;
            }
            uVar9 = (this->super_state_base).m_match_hist[2];
            *(undefined8 *)((this->super_state_base).m_match_hist + 1) =
                 *(undefined8 *)(this->super_state_base).m_match_hist;
            (this->super_state_base).m_match_hist[0] = uVar9;
          }
          else {
            bVar7 = symbol_codec::encode(codec,0,(adaptive_bit_model *)model_00,true);
            if (!bVar7) {
              return false;
            }
            uVar9 = (this->super_state_base).m_match_hist[0];
            uVar5 = (this->super_state_base).m_match_hist[1];
            uVar6 = (this->super_state_base).m_match_hist[2];
            (this->super_state_base).m_match_hist[0] = (this->super_state_base).m_match_hist[3];
            (this->super_state_base).m_match_hist[1] = uVar9;
            (this->super_state_base).m_match_hist[2] = uVar5;
            (this->super_state_base).m_match_hist[3] = uVar6;
          }
        }
      }
      uVar9 = (uint)(6 < (this->super_state_base).m_cur_state) * 3 + 8;
      goto LAB_00109828;
    }
  }
  else {
    bVar7 = symbol_codec::encode(codec,0,paVar11,true);
    if (!bVar7) {
      return false;
    }
    uVar13 = lzdec->m_dist;
    if ((ulong)uVar13 < 0x1000) {
      uVar8 = (uint)lzbase->m_slot_tab0[uVar13];
    }
    else if (uVar13 < 0x100000) {
      uVar8 = (uint)lzbase->m_slot_tab1[uVar13 >> 0xb];
    }
    else if (uVar13 < 0x1000000) {
      uVar8 = (uint)lzbase->m_slot_tab2[uVar13 >> 0x10];
    }
    else if (uVar13 < 0x2000000) {
      uVar8 = (uVar13 - 0x1000000 >> 0x17) + 0x30;
    }
    else if (uVar13 < 0x4000000) {
      uVar8 = (uVar13 + 0xfe000000 >> 0x18) + 0x32;
    }
    else {
      uVar8 = (uVar13 + 0xfc000000 >> 0x19) + 0x34;
    }
    uVar13 = uVar13 - (lzbase->super_CLZDecompBase).m_lzx_position_base[uVar8] &
             (lzbase->super_CLZDecompBase).m_lzx_position_extra_mask[uVar8];
    iVar3 = lzdec->m_len;
    uVar9 = 0xffffffff;
    if (8 < iVar3) {
      uVar9 = iVar3 - 9;
    }
    uVar10 = 7;
    if (iVar3 < 9) {
      uVar10 = iVar3 - 2;
    }
    bVar7 = symbol_codec::encode(codec,(uVar8 * 8 - 8 | uVar10) + 2,&this->m_main_table);
    if ((bVar7) &&
       (((int)uVar9 < 0 ||
        (bVar7 = symbol_codec::encode
                           (codec,uVar9,
                            this->m_large_len_table + (6 < (this->super_state_base).m_cur_state)),
        bVar7)))) {
      bVar2 = (lzbase->super_CLZDecompBase).m_lzx_position_extra_bits[uVar8];
      if (bVar2 < 3) {
        bVar7 = symbol_codec::encode_bits(codec,uVar13,(uint)bVar2);
      }
      else {
        if ((4 < bVar2) && (bVar7 = symbol_codec::encode_bits(codec,uVar13 >> 4,bVar2 - 4), !bVar7))
        {
          return false;
        }
        bVar7 = symbol_codec::encode(codec,uVar13 & 0xf,&this->m_dist_lsb_table);
      }
      if (bVar7 != false) {
        uVar9 = lzdec->m_dist;
        (this->super_state_base).m_match_hist[3] = (this->super_state_base).m_match_hist[2];
        *(undefined8 *)((this->super_state_base).m_match_hist + 1) =
             *(undefined8 *)(this->super_state_base).m_match_hist;
        (this->super_state_base).m_match_hist[0] = uVar9;
        uVar9 = (uint)(6 < (this->super_state_base).m_cur_state) * 3 + 7;
        goto LAB_00109828;
      }
    }
  }
  return false;
}

Assistant:

bool lzcompressor::state::encode(symbol_codec& codec, CLZBase& lzbase, const search_accelerator& dict, const lzdecision& lzdec)
   {
      const uint lit_pred0 = get_pred_char(dict, lzdec.m_pos, 1);

      uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(lit_pred0, m_cur_state);
      if (!codec.encode(lzdec.is_match(), m_is_match_model[is_match_model_index])) return false;

      if (!lzdec.is_match())
      {
         const uint lit = dict[lzdec.m_pos];

#ifdef LZHAM_LZDEBUG
         if (!codec.encode_bits(lit, 8)) return false;
#endif

         if (m_cur_state < CLZBase::cNumLitStates)
         {
            const uint lit_pred1 = get_pred_char(dict, lzdec.m_pos, 2);

            uint lit_pred = (lit_pred0 >> (8 - CLZBase::cNumLitPredBits/2)) |
               (((lit_pred1 >> (8 - CLZBase::cNumLitPredBits/2)) << CLZBase::cNumLitPredBits/2));

            // literal
            if (!codec.encode(lit, m_lit_table[lit_pred])) return false;
         }
         else
         {
            // delta literal
            const uint rep_lit0 = dict[(lzdec.m_pos - m_match_hist[0]) & dict.m_max_dict_size_mask];
            const uint rep_lit1 = dict[(lzdec.m_pos - m_match_hist[0] - 1) & dict.m_max_dict_size_mask];

            uint delta_lit = rep_lit0 ^ lit;

            uint lit_pred = (rep_lit0 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) |
                            ((rep_lit1 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) << CLZBase::cNumDeltaLitPredBits/2);

#ifdef LZHAM_LZDEBUG
            if (!codec.encode_bits(rep_lit0, 8)) return false;
#endif

            if (!codec.encode(delta_lit, m_delta_lit_table[lit_pred])) return false;
         }

         if (m_cur_state < 4) m_cur_state = 0; else if (m_cur_state < 10) m_cur_state -= 3; else m_cur_state -= 6;
      }
      else
      {
         // match
         if (lzdec.m_dist < 0)
         {
            // rep match
            if (!codec.encode(1, m_is_rep_model[m_cur_state])) return false;

            int match_hist_index = -lzdec.m_dist - 1;

            if (!match_hist_index)
            {
               // rep0 match
               if (!codec.encode(1, m_is_rep0_model[m_cur_state])) return false;

               if (lzdec.m_len == 1)
               {
                  // single byte rep0
                  if (!codec.encode(1, m_is_rep0_single_byte_model[m_cur_state])) return false;

                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 9 : 11;
               }
               else
               {
                  // normal rep0
                  if (!codec.encode(0, m_is_rep0_single_byte_model[m_cur_state])) return false;

                  if (!codec.encode(lzdec.m_len - cMinMatchLen, m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates])) return false;

                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
               }
            }
            else
            {
               // rep1-rep3 match
               if (!codec.encode(0, m_is_rep0_model[m_cur_state])) return false;

               if (!codec.encode(lzdec.m_len - cMinMatchLen, m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates])) return false;

               if (match_hist_index == 1)
               {
                  // rep1
                  if (!codec.encode(1, m_is_rep1_model[m_cur_state])) return false;

                  std::swap(m_match_hist[0], m_match_hist[1]);
               }
               else
               {
                  if (!codec.encode(0, m_is_rep1_model[m_cur_state])) return false;

                  if (match_hist_index == 2)
                  {
                     // rep2
                     if (!codec.encode(1, m_is_rep2_model[m_cur_state])) return false;

                     int dist = m_match_hist[2];
                     m_match_hist[2] = m_match_hist[1];
                     m_match_hist[1] = m_match_hist[0];
                     m_match_hist[0] = dist;
                  }
                  else
                  {
                     // rep3
                     if (!codec.encode(0, m_is_rep2_model[m_cur_state])) return false;

                     int dist = m_match_hist[3];
                     m_match_hist[3] = m_match_hist[2];
                     m_match_hist[2] = m_match_hist[1];
                     m_match_hist[1] = m_match_hist[0];
                     m_match_hist[0] = dist;
                  }
               }

               m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
            }
         }
         else
         {
            if (!codec.encode(0, m_is_rep_model[m_cur_state])) return false;

            LZHAM_ASSERT(lzdec.m_len >= cMinMatchLen);

            // full match
            uint match_slot, match_extra;
            lzbase.compute_lzx_position_slot(lzdec.m_dist, match_slot, match_extra);

            uint match_low_sym = 0;
            int large_len_sym = -1;
            if (lzdec.m_len >= 9)
            {
               match_low_sym = 7;

               large_len_sym = lzdec.m_len - 9;
            }
            else
               match_low_sym = lzdec.m_len - 2;

            uint match_high_sym = 0;

            LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
            match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

            uint main_sym = match_low_sym | (match_high_sym << 3);

            if (!codec.encode(CLZBase::cLZXNumSpecialLengths + main_sym, m_main_table)) return false;

            if (large_len_sym >= 0)
            {
               if (!codec.encode(large_len_sym, m_large_len_table[m_cur_state >= CLZBase::cNumLitStates])) return false;
            }

            uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
            if (num_extra_bits < 3)
            {
               if (!codec.encode_bits(match_extra, num_extra_bits)) return false;
            }
            else
            {
               if (num_extra_bits > 4)
               {
                  if (!codec.encode_bits((match_extra >> 4), num_extra_bits - 4)) return false;
               }

               if (!codec.encode(match_extra & 15, m_dist_lsb_table)) return false;
            }

            update_match_hist(lzdec.m_dist);

            m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? CLZBase::cNumLitStates : CLZBase::cNumLitStates + 3;
         }

#ifdef LZHAM_LZDEBUG
         if (!codec.encode_bits(m_match_hist[0], 29)) return false;
#endif
      }

      m_cur_ofs = lzdec.m_pos + lzdec.get_len();
      return true;
   }